

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-flow-kill.c
# Opt level: O1

void borg_delete_kill(wchar_t i)

{
  ushort uVar1;
  _Bool _Var2;
  char *pcVar3;
  borg_kill *__s;
  
  uVar1 = borg_kills[i].r_idx;
  if (uVar1 != 0) {
    __s = borg_kills + i;
    if ((int)(uint)uVar1 < (int)(z_info->r_max - 1)) {
      pcVar3 = r_info[(uint)uVar1].name;
    }
    else {
      pcVar3 = "player ghost";
    }
    pcVar3 = format("# Forgetting a monster \'%s\' at (%d,%d)",pcVar3,(ulong)(uint)(__s->pos).y,
                    (ulong)(uint)(__s->pos).x);
    borg_note(pcVar3);
    if (((borg.goal.type == 1) && ((__s->pos).y == (uint)borg_flow_y[0])) &&
       ((__s->pos).x == (uint)borg_flow_x[0])) {
      borg.goal.type = 0;
    }
    borg_grids[(__s->pos).y][(__s->pos).x].kill = '\0';
    _Var2 = flag_has_dbg(r_info[__s->r_idx].flags,0xb,0x11,"r_info[kill->r_idx].flags","RF_MULTIPLY"
                        );
    if (_Var2) {
      borg.when_last_kill_mult = borg_t;
    }
    memset(__s,0,0x1d8);
    borg_kills_cnt = borg_kills_cnt + -1;
    borg_danger_wipe = true;
  }
  return;
}

Assistant:

void borg_delete_kill(int i)
{
    borg_kill *kill = &borg_kills[i];

    /* Paranoia -- Already wiped */
    if (!kill->r_idx)
        return;

    /* Note */
    borg_note(format("# Forgetting a monster '%s' at (%d,%d)",
        borg_race_name(kill->r_idx), kill->pos.y, kill->pos.x));
    /* Clear goals if I am flowing to this monster.*/
    if (borg.goal.type == GOAL_KILL && borg_flow_y[0] == kill->pos.y
        && borg_flow_x[0] == kill->pos.x)
        borg.goal.type = 0;

    /* Update the grids */
    borg_grids[kill->pos.y][kill->pos.x].kill = 0;

    /* save a time stamp of when the last multiplier was killed */
    if (rf_has(r_info[kill->r_idx].flags, RF_MULTIPLY))
        borg.when_last_kill_mult = borg_t;

    /* Kill the monster */
    memset(kill, 0, sizeof(borg_kill));

    /* One less monster */
    borg_kills_cnt--;

    /* Recalculate danger */
    borg_danger_wipe = true;
}